

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * Lowerer::InsertSub(bool needFlags,Opnd *dst,Opnd *src1,Opnd *src2,Instr *insertBeforeInstr)

{
  Func *func;
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  IntConstOpnd *this;
  
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,16000,"(dst)","dst");
    if (!bVar3) goto LAB_005d1fb9;
    *puVar5 = 0;
  }
  if (src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3e81,"(src1)","src1");
    if (!bVar3) goto LAB_005d1fb9;
    *puVar5 = 0;
  }
  if (src2 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3e82,"(src2)","src2");
    if (!bVar3) goto LAB_005d1fb9;
    *puVar5 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3e83,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) goto LAB_005d1fb9;
    *puVar5 = 0;
  }
  func = insertBeforeInstr->m_func;
  OVar4 = IR::Opnd::GetKind(src2);
  if (OVar4 == OpndKindIntConst) {
    OVar4 = IR::Opnd::GetKind(src2);
    if (OVar4 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar3) {
LAB_005d1fb9:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pp_Var1 = src2[1]._vptr_Opnd;
    if (pp_Var1 != (_func_int **)0xffffffff80000000 && (long)pp_Var1 < 0) {
      this = IR::IntConstOpnd::CopyInternal((IntConstOpnd *)src2,func);
      IR::IntConstOpnd::SetValue(this,-(long)pp_Var1);
      pIVar6 = InsertAdd(needFlags,dst,src1,&this->super_Opnd,insertBeforeInstr);
      return pIVar6;
    }
  }
  pIVar6 = IR::Instr::New(Sub_A,dst,src1,src2,func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar6);
  LowererMD::ChangeToSub(pIVar6,needFlags);
  LowererMD::Legalize<false>(pIVar6,false);
  return pIVar6;
}

Assistant:

IR::Instr *Lowerer::InsertSub(
    const bool needFlags,
    IR::Opnd *const dst,
    IR::Opnd *src1,
    IR::Opnd *src2,
    IR::Instr *const insertBeforeInstr)
{
    Assert(dst);
    Assert(src1);
    Assert(src2);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    if(src2->IsIntConstOpnd())
    {
        IR::IntConstOpnd *const intConstOpnd = src2->AsIntConstOpnd();
        const IntConstType value = intConstOpnd->GetValue();
        if(value < 0 && value != IntConstMin)
        {
            // Change (s1 = s1 - -5) into (s1 = s1 + 5)
            IR::IntConstOpnd *const newSrc2 = intConstOpnd->CopyInternal(func);
            newSrc2->SetValue(-value);
            return InsertAdd(needFlags, dst, src1, newSrc2, insertBeforeInstr);
        }
    }

    IR::Instr *const instr = IR::Instr::New(Js::OpCode::Sub_A, dst, src1, src2, func);

    insertBeforeInstr->InsertBefore(instr);
    LowererMD::ChangeToSub(instr, needFlags);
    LowererMD::Legalize(instr);
    return instr;
}